

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type1Test.cpp
# Opt level: O0

EStatusCode SaveCharstringCode(char **argv,string *inCharStringName,Type1Input *inType1Input)

{
  OutputFileStream *inType1Input_00;
  EStatusCode EVar1;
  IByteWriter *inWriter;
  undefined1 local_110 [8];
  CharStringType1Tracer tracer;
  allocator<char> local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78;
  EStatusCode local_54;
  undefined1 local_50 [4];
  EStatusCode status;
  OutputFile glyphFile;
  Type1Input *inType1Input_local;
  string *inCharStringName_local;
  char **argv_local;
  
  glyphFile.mFileStream = (OutputFileStream *)inType1Input;
  OutputFile::OutputFile((OutputFile *)local_50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"glyphType1_",&local_d9);
  std::operator+(&local_b8,&local_d8,inCharStringName);
  std::operator+(&local_98,&local_b8,"_.txt");
  BuildRelativeOutputPath(&local_78,argv,&local_98);
  EVar1 = OutputFile::OpenFile((OutputFile *)local_50,&local_78,false);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator(&local_d9);
  local_54 = EVar1;
  if (EVar1 == eSuccess) {
    CharStringType1Tracer::CharStringType1Tracer((CharStringType1Tracer *)local_110);
    inType1Input_00 = glyphFile.mFileStream;
    inWriter = &OutputFile::GetOutputStream((OutputFile *)local_50)->super_IByteWriter;
    local_54 = CharStringType1Tracer::TraceGlyphProgram
                         ((CharStringType1Tracer *)local_110,inCharStringName,
                          (Type1Input *)inType1Input_00,inWriter);
    CharStringType1Tracer::~CharStringType1Tracer((CharStringType1Tracer *)local_110);
  }
  OutputFile::CloseFile((OutputFile *)local_50);
  EVar1 = local_54;
  OutputFile::~OutputFile((OutputFile *)local_50);
  return EVar1;
}

Assistant:

static EStatusCode SaveCharstringCode(char* argv[],const string& inCharStringName,Type1Input* inType1Input)
{
	OutputFile glyphFile;

    
	EStatusCode status = glyphFile.OpenFile(
                                            BuildRelativeOutputPath(argv,string("glyphType1_") + inCharStringName + "_.txt"));

	do
	{
		if(status != PDFHummus::eSuccess)
			break;
		
		CharStringType1Tracer tracer;

		status = tracer.TraceGlyphProgram(inCharStringName,inType1Input,glyphFile.GetOutputStream());

	}while(false);

	glyphFile.CloseFile();

	return status;

}